

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

void render_state_begin(element_t *element,render_state_t *state,render_state_t *parent)

{
  plutovg_matrix_t *matrix;
  float fVar1;
  float fVar2;
  float fVar3;
  _Bool _Var4;
  float *number;
  
  state->parent = parent;
  state->element = element;
  state->mode = parent->mode;
  state->opacity = parent->opacity;
  fVar1 = (parent->matrix).b;
  fVar2 = (parent->matrix).c;
  fVar3 = (parent->matrix).d;
  (state->matrix).a = (parent->matrix).a;
  (state->matrix).b = fVar1;
  (state->matrix).c = fVar2;
  (state->matrix).d = fVar3;
  fVar1 = (parent->matrix).f;
  (state->matrix).e = (parent->matrix).e;
  (state->matrix).f = fVar1;
  (state->extents).x = 0.0;
  (state->extents).y = 0.0;
  (state->extents).w = -1.0;
  (state->extents).h = -1.0;
  fVar1 = parent->view_height;
  state->view_width = parent->view_width;
  state->view_height = fVar1;
  if (element->parent != (element *)0x0) {
    matrix = &state->matrix;
    _Var4 = parse_transform(element,0x26,matrix);
    if (_Var4) {
      plutovg_matrix_multiply(matrix,matrix,&parent->matrix);
    }
  }
  if (state->mode == render_mode_painting) {
    number = &state->opacity;
    _Var4 = parse_number(element,0x14,number,true,false);
    if (_Var4) {
      *number = parent->opacity * *number;
    }
  }
  return;
}

Assistant:

static void render_state_begin(const element_t* element, render_state_t* state, render_state_t* parent)
{
    state->parent = parent;
    state->element = element;
    state->mode = parent->mode;
    state->opacity = parent->opacity;
    state->matrix = parent->matrix;
    state->extents = INVALID_RECT;

    state->view_width = parent->view_width;
    state->view_height = parent->view_height;

    if(element->parent && parse_transform(element, ATTR_TRANSFORM, &state->matrix))
        plutovg_matrix_multiply(&state->matrix, &state->matrix, &parent->matrix);
    if(state->mode == render_mode_painting) {
        if(parse_number(element, ATTR_OPACITY, &state->opacity, true, false)) {
            state->opacity *= parent->opacity;
        }
    }
}